

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

char * skip_quoted(char **buf,char *delimiters,char *whitespace,char quotechar)

{
  char cVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  char *__src;
  
  __s = *buf;
  sVar2 = strcspn(__s,delimiters);
  __src = __s + sVar2;
  if (0 < (long)sVar2) {
    cVar1 = __src[-1];
    pcVar4 = __src + -1;
    while (cVar1 == (char)whitespace) {
      if (*__src == '\0') {
        *pcVar4 = '\0';
        break;
      }
      sVar2 = strcspn(__src + 1,delimiters);
      memmove(pcVar4,__src,sVar2 + 1);
      __src = __src + sVar2 + 1;
      cVar1 = pcVar4[sVar2];
      pcVar4 = pcVar4 + sVar2;
    }
    if (pcVar4 + 1 < __src) {
      memset(pcVar4 + 1,0,(size_t)(__src + ~(ulong)pcVar4));
    }
  }
  pcVar4 = __src;
  if (*__src != '\0') {
    sVar2 = strspn(__src + 1," ");
    pcVar4 = __src + sVar2 + 1;
    if (__src < pcVar4) {
      lVar3 = 0;
      if (__src <= __src + sVar2) {
        lVar3 = (long)(__src + sVar2) - (long)__src;
      }
      memset(__src,0,lVar3 + 1);
    }
  }
  *buf = pcVar4;
  return __s;
}

Assistant:

static char *
skip_quoted(char **buf,
            const char *delimiters,
            const char *whitespace,
            char quotechar)
{
	char *p, *begin_word, *end_word, *end_whitespace;

	begin_word = *buf;
	end_word = begin_word + strcspn(begin_word, delimiters);

	/* Check for quotechar */
	if (end_word > begin_word) {
		p = end_word - 1;
		while (*p == quotechar) {
			/* While the delimiter is quoted, look for the next delimiter. */
			/* This happens, e.g., in calls from parse_auth_header,
			 * if the user name contains a " character. */

			/* If there is anything beyond end_word, copy it. */
			if (*end_word != '\0') {
				size_t end_off = strcspn(end_word + 1, delimiters);
				memmove(p, end_word, end_off + 1);
				p += end_off; /* p must correspond to end_word - 1 */
				end_word += end_off + 1;
			} else {
				*p = '\0';
				break;
			}
		}
		for (p++; p < end_word; p++) {
			*p = '\0';
		}
	}

	if (*end_word == '\0') {
		*buf = end_word;
	} else {

#if defined(GCC_DIAGNOSTIC)
		/* Disable spurious conversion warning for GCC */
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif /* defined(GCC_DIAGNOSTIC) */

		end_whitespace = end_word + strspn(&end_word[1], whitespace) + 1;

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic pop
#endif /* defined(GCC_DIAGNOSTIC) */

		for (p = end_word; p < end_whitespace; p++) {
			*p = '\0';
		}

		*buf = end_whitespace;
	}

	return begin_word;
}